

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

bool duckdb::RLEFun::TypeIsSupported(PhysicalType physical_type)

{
  uint uVar1;
  undefined7 in_register_00000039;
  
  uVar1 = (uint)CONCAT71(in_register_00000039,physical_type);
  if (((0x17 < uVar1) || ((0x801bfeU >> (uVar1 & 0x1f) & 1) == 0)) && (1 < uVar1 - 0xcb)) {
    return false;
  }
  return true;
}

Assistant:

bool RLEFun::TypeIsSupported(const PhysicalType physical_type) {
	switch (physical_type) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
	case PhysicalType::INT16:
	case PhysicalType::INT32:
	case PhysicalType::INT64:
	case PhysicalType::INT128:
	case PhysicalType::UINT8:
	case PhysicalType::UINT16:
	case PhysicalType::UINT32:
	case PhysicalType::UINT64:
	case PhysicalType::UINT128:
	case PhysicalType::FLOAT:
	case PhysicalType::DOUBLE:
	case PhysicalType::LIST:
		return true;
	default:
		return false;
	}
}